

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# last_modification_time.h
# Opt level: O0

double last_modification_time(string *path)

{
  int iVar1;
  char *__file;
  undefined1 local_b8 [8];
  timespec t;
  stat s;
  string *path_local;
  
  memset(local_b8,0,0x10);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)&t.tv_nsec);
  if (iVar1 < 0) {
    path_local = (string *)0xbff0000000000000;
  }
  else {
    path_local = (string *)((double)s.st_mtim.tv_sec * 1e-09 + (double)s.st_atim.tv_nsec);
  }
  return (double)path_local;
}

Assistant:

double last_modification_time(const std::string & path)
{
  struct stat s;
  struct timespec t = {0,0};
  if (stat(path.c_str(), &s) < 0) { return -1; }
#ifdef __APPLE__
  t = s.st_mtimespec;
#else // Linux?
  t = s.st_mtim;
#endif
  return double(t.tv_sec) + double(t.tv_nsec)*1e-9;
}